

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Matlab.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Matlab::ArchiveOUT(ChFunction_Matlab *this,ChArchiveOut *marchive)

{
  ChNameValue<char[200]> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Matlab>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_28._value = &this->mat_command;
  local_28._name = "mat_command";
  local_28._flags = '\0';
  ChArchiveOut::out<char,200ul>(marchive,&local_28);
  return;
}

Assistant:

void ChFunction_Matlab::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Matlab>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(mat_command);
}